

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

DdNode * Abc_NtkSparsifyInternalOne(DdManager *ddNew,DdNode *bFunc,int nFanins,int nPerc)

{
  int k;
  DdNode **pbCubes;
  DdNode *n;
  double dVar1;
  DdNode *bRes;
  DdNode **pbMints;
  int local_28;
  int nMints;
  int i;
  int nSpace;
  int nPerc_local;
  int nFanins_local;
  DdNode *bFunc_local;
  DdManager *ddNew_local;
  
  dVar1 = Cudd_CountMinterm(ddNew,bFunc,nFanins);
  k = Abc_MaxInt(1,(int)((double)nPerc * 0.01 * (double)(int)dVar1));
  pbCubes = Cudd_bddPickArbitraryMinterms(ddNew,bFunc,ddNew->vars,nFanins,k);
  for (local_28 = 0; local_28 < k; local_28 = local_28 + 1) {
    Cudd_Ref(pbCubes[local_28]);
  }
  n = Extra_bddComputeSum(ddNew,pbCubes,k);
  Cudd_Ref(n);
  for (local_28 = 0; local_28 < k; local_28 = local_28 + 1) {
    Cudd_RecursiveDeref(ddNew,pbCubes[local_28]);
  }
  Cudd_Deref(n);
  if (pbCubes != (DdNode **)0x0) {
    free(pbCubes);
  }
  return n;
}

Assistant:

DdNode * Abc_NtkSparsifyInternalOne( DdManager * ddNew, DdNode * bFunc, int nFanins, int nPerc )
{
    int nSpace = (int)Cudd_CountMinterm( ddNew, bFunc, nFanins );
    int i, nMints = Abc_MaxInt( 1, (int)(0.01 * nPerc * nSpace) );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( ddNew, bFunc, ddNew->vars, nFanins, nMints );
    DdNode * bRes;
    for ( i = 0; i < nMints; i++ )
        Cudd_Ref( pbMints[i] );
    bRes = Extra_bddComputeSum( ddNew, pbMints, nMints ); Cudd_Ref( bRes );
    for ( i = 0; i < nMints; i++ )
        Cudd_RecursiveDeref( ddNew, pbMints[i] );
    Cudd_Deref( bRes );
    ABC_FREE( pbMints );
    return bRes;
}